

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

LocalizedNumberFormatter * __thiscall
icu_63::number::NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::macros
          (LocalizedNumberFormatter *__return_storage_ptr__,
          NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter> *this,MacroProps *macros
          )

{
  PluralRules *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  UNumberSignDisplay UVar5;
  long lVar6;
  Precision *pPVar7;
  Precision *pPVar8;
  byte bVar9;
  
  bVar9 = 0;
  impl::MacroProps::MacroProps((MacroProps *)__return_storage_ptr__,&this->fMacros);
  __return_storage_ptr__->fCompiled = (NumberFormatterImpl *)0x0;
  __return_storage_ptr__->fUnsafeCallCount[0] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[1] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[2] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[3] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[4] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[5] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[6] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[7] = '\0';
  *(undefined8 *)
   &(__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>
    ).fMacros.notation = *(undefined8 *)&macros->notation;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.notation.fUnion.scientific.fExponentSignDisplay =
       (macros->notation).fUnion.scientific.fExponentSignDisplay;
  MeasureUnit::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.unit,
             &macros->unit);
  MeasureUnit::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
              perUnit,&macros->perUnit);
  pPVar7 = &macros->precision;
  pPVar8 = &(__return_storage_ptr__->
            super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
            precision;
  for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar4 = *(undefined4 *)&pPVar7->field_0x4;
    pPVar8->fType = pPVar7->fType;
    *(undefined4 *)&pPVar8->field_0x4 = uVar4;
    pPVar7 = (Precision *)((long)pPVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    pPVar8 = (Precision *)((long)pPVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.integerWidth.fHasError = (macros->integerWidth).fHasError;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           integerWidth.fUnion + 4) = *(undefined4 *)((long)&(macros->integerWidth).fUnion + 4);
  impl::SymbolsWrapper::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
              symbols,&macros->symbols);
  UVar5 = macros->sign;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.unitWidth = macros->unitWidth;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.sign = UVar5;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.decimal = macros->decimal;
  Scale::operator=(&(__return_storage_ptr__->
                    super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros
                    .scale,&macros->scale);
  pPVar1 = macros->rules;
  uVar2 = *(undefined8 *)((long)&macros->rules + 4);
  uVar3 = *(undefined8 *)((long)&macros->currencySymbols + 4);
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.affixProvider = macros->affixProvider;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.rules = pPVar1;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.rules +
   4) = uVar2;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           currencySymbols + 4) = uVar3;
  Locale::operator=(&(__return_storage_ptr__->
                     super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                     fMacros.locale,&macros->locale);
  return __return_storage_ptr__;
}

Assistant:

Derived NumberFormatterSettings<Derived>::macros(impl::MacroProps&& macros) const& {
    Derived copy(*this);
    copy.fMacros = std::move(macros);
    return copy;
}